

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_DecodeBase58CheckDataEmpty_Test::TestBody
          (CryptoUtil_DecodeBase58CheckDataEmpty_Test *this)

{
  pointer *this_00;
  bool bVar1;
  char *message;
  char *in_R9;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  undefined1 local_48 [8];
  ByteData byte_data;
  string data;
  CryptoUtil_DecodeBase58CheckDataEmpty_Test *this_local;
  
  this_00 = &byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)this_00);
  cfd::core::CryptoUtil::DecodeBase58Check((ByteData *)local_48,(string *)this_00);
  cfd::core::ByteData::~ByteData((ByteData *)local_48);
  std::__cxx11::string::~string
            ((string *)
             &byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_91 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_90,(AssertionResult *)0x6e96c0,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x280,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(CryptoUtil, DecodeBase58CheckDataEmpty) {
  try {
    std::string data;
    ByteData byte_data = CryptoUtil::DecodeBase58Check(data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Decode base58 error.");
    return;
  }
  ASSERT_TRUE(false);
}